

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

CalculatedFloat
absl::anon_unknown_0::CalculateFromParsedHexadecimal<double>(ParsedFloat *parsed_hex)

{
  unsigned_long *in_RDI;
  CalculatedFloat CVar1;
  CalculatedFloat CVar2;
  bool result_exact;
  int shift;
  int mantissa_width;
  int exponent;
  uint64_t mantissa;
  Nonnull<bool_*> in_stack_00000140;
  bool in_stack_0000014b;
  int in_stack_0000014c;
  undefined1 in_stack_00000150 [16];
  undefined8 in_stack_ffffffffffffffa8;
  int exponent_00;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint128 local_48;
  int local_2c;
  type local_28;
  int local_24;
  unsigned_long local_20;
  
  exponent_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_20 = *in_RDI;
  local_24 = (int)in_RDI[1];
  local_28 = bit_width<unsigned_long>(0x3c262c);
  local_2c = NormalizedShiftSize<double>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  local_24 = local_24 + local_2c;
  uint128::uint128(&local_48,local_20);
  local_20 = ShiftRightAndRound((uint128)in_stack_00000150,in_stack_0000014c,in_stack_0000014b,
                                in_stack_00000140);
  CVar1 = CalculatedFloatFromRawValues<double>
                    (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),exponent_00);
  CVar2._12_4_ = 0;
  CVar2.mantissa = SUB128(CVar1._0_12_,0);
  CVar2.exponent = SUB124(CVar1._0_12_,8);
  return CVar2;
}

Assistant:

CalculatedFloat CalculateFromParsedHexadecimal(
    const strings_internal::ParsedFloat& parsed_hex) {
  uint64_t mantissa = parsed_hex.mantissa;
  int exponent = parsed_hex.exponent;
  // This static_cast is only needed when using a std::bit_width()
  // implementation that does not have the fix for LWG 3656 applied.
  int mantissa_width = static_cast<int>(bit_width(mantissa));
  const int shift = NormalizedShiftSize<FloatType>(mantissa_width, exponent);
  bool result_exact;
  exponent += shift;
  mantissa = ShiftRightAndRound(mantissa, shift,
                                /* input exact= */ true, &result_exact);
  // ParseFloat handles rounding in the hexadecimal case, so we don't have to
  // check `result_exact` here.
  return CalculatedFloatFromRawValues<FloatType>(mantissa, exponent);
}